

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> __thiscall
duckdb::ColumnWriter::CreateWriterRecursive
          (ColumnWriter *this,ClientContext *context,ParquetWriter *writer,
          vector<duckdb_parquet::SchemaElement,_true> *parquet_schemas,ParquetColumnSchema *schema,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *path_in_schema)

{
  pointer *this_00;
  LogicalType LVar1;
  char cVar2;
  ParquetColumnSchema *pPVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> _Var7;
  pointer puVar8;
  int iVar9;
  const_reference pvVar10;
  undefined8 *puVar11;
  const_reference pvVar12;
  ArrayColumnWriter *this_01;
  _func_int *p_Var13;
  _func_int **pp_Var14;
  InternalException *this_02;
  ParquetColumnSchema *pPVar15;
  size_type __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  bool bVar16;
  bool bVar17;
  bool can_have_nulls;
  undefined1 local_159;
  ParquetWriter *local_158;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> local_150;
  pointer local_148;
  pointer pbStack_140;
  ParquetColumnSchema *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
  local_108;
  pointer local_e8;
  pointer pbStack_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  ColumnWriter local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_158 = writer;
  local_150._M_head_impl = this;
  local_e8 = (pointer)context;
  pvVar10 = vector<duckdb_parquet::SchemaElement,_true>::operator[]
                      (parquet_schemas,schema->schema_index);
  local_159 = (code)(pvVar10->repetition_type == OPTIONAL);
  local_148 = (pointer)path_in_schema;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&path_in_schema->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&schema->name);
  LVar1 = schema->type;
  local_130 = schema;
  if ((LVar1 == (LogicalType)0x6b) || (LVar1 == (LogicalType)0x64)) {
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::reserve((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               *)(local_118 + 0x10),
              ((long)(schema->children).
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(schema->children).
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7);
    pPVar15 = (schema->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              .
              super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (schema->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar15 != pPVar3) {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_148);
        CreateWriterRecursive
                  ((ColumnWriter *)local_128,(ClientContext *)local_e8,local_158,parquet_schemas,
                   pPVar15,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)&local_48);
        std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                    *)(local_118 + 0x10),
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)local_128);
        if ((pointer)local_128._0_8_ != (pointer)0x0) {
          (**(code **)(*(_func_int **)local_128._0_8_ + 8))();
        }
        local_128._0_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        pPVar15 = pPVar15 + 1;
      } while (pPVar15 != pPVar3);
    }
    puVar11 = (undefined8 *)operator_new(0x50);
    puVar8 = local_108.
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar4 = (pointer)(local_148->field_2)._M_allocated_capacity;
    pbVar5 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_148->_M_dataplus)->_M_impl)->_M_impl).super__Vector_impl_data._M_start
    ;
    pbVar6 = (pointer)local_148->_M_string_length;
    (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_148->_M_dataplus)->_M_impl)->_M_impl).super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_148->_M_string_length = 0;
    (local_148->field_2)._M_allocated_capacity = 0;
    local_148 = (pointer)local_108.
                         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    pbStack_140 = (pointer)local_108.
                           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar11[1] = local_158;
    puVar11[2] = local_130;
    puVar11[3] = pbVar5;
    puVar11[4] = pbVar6;
    puVar11[5] = pbVar4;
    local_118._0_8_ = (ParquetColumnSchema *)0x0;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (ParquetWriter *)0x0;
    *(code *)(puVar11 + 6) = local_159;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
    *puVar11 = &PTR__StructColumnWriter_0049ff30;
    puVar11[7] = local_148;
    puVar11[8] = pbStack_140;
    puVar11[9] = puVar8;
    local_b8.column_schema = (ParquetColumnSchema *)0x0;
    local_b8._vptr_ColumnWriter = (_func_int **)0x0;
    local_b8.writer = (ParquetWriter *)0x0;
    std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               *)&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    (local_150._M_head_impl)->_vptr_ColumnWriter = puVar11;
LAB_0024a55f:
    _Var7._M_head_impl = local_150._M_head_impl;
    std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               *)(local_118 + 0x10));
    return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
           _Var7._M_head_impl;
  }
  if ((byte)LVar1 < 0x66) {
    if (LVar1 != (LogicalType)0x1a) {
      bVar17 = LVar1 == (LogicalType)0x65;
      goto LAB_0024a5a6;
    }
    duckdb::LogicalType::GetAlias_abi_cxx11_();
    iVar9 = std::__cxx11::string::compare(local_128);
    if (iVar9 == 0) {
      bVar17 = GeoParquetFileMetadata::IsGeoParquetConversionEnabled((ClientContext *)local_e8);
    }
    else {
      bVar17 = false;
    }
    if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
    if (bVar17 != false) {
      make_uniq<duckdb::WKBColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&,std::__cxx11::string_const&>
                ((duckdb *)local_128,local_158,local_130,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_148,(bool *)&local_159,&schema->name);
      goto LAB_0024ada9;
    }
    LVar1 = schema->type;
  }
  else {
    if (LVar1 == (LogicalType)0x66) {
      local_128._0_8_ = (pointer)(local_128 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"key_value","");
      pPVar15 = local_130;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_);
      }
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ::reserve((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 *)(local_118 + 0x10),2);
      __n = 0;
      bVar17 = true;
      do {
        bVar16 = bVar17;
        pvVar12 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&pPVar15->children,__n);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_60,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_148);
        CreateWriterRecursive
                  ((ColumnWriter *)local_128,(ClientContext *)local_e8,local_158,parquet_schemas,
                   pvVar12,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                    *)(local_118 + 0x10),
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)local_128);
        if ((pointer)local_128._0_8_ != (pointer)0x0) {
          (**(code **)(*(_func_int **)local_128._0_8_ + 8))();
        }
        __n = 1;
        bVar17 = false;
      } while (bVar16);
      p_Var13 = (_func_int *)operator_new(0x50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148);
      pbVar6 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar5 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = local_108.
               super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8 = (pointer)local_108.
                          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      pbStack_e0 = (pointer)local_108.
                            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined ***)p_Var13 = &PTR__ColumnWriter_00497170;
      *(ParquetWriter **)(p_Var13 + 8) = local_158;
      *(ParquetColumnSchema **)(p_Var13 + 0x10) = local_130;
      *(pointer *)(p_Var13 + 0x18) = pbVar4;
      *(pointer *)(p_Var13 + 0x20) = pbVar5;
      *(pointer *)(p_Var13 + 0x28) = pbVar6;
      local_118._0_8_ = (ParquetColumnSchema *)0x0;
      local_128._0_8_ = (pointer)0x0;
      local_128._8_8_ = (ParquetWriter *)0x0;
      p_Var13[0x30] = local_159;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      *(undefined ***)p_Var13 = &PTR__StructColumnWriter_0049ff30;
      *(pointer *)(p_Var13 + 0x38) = local_e8;
      *(pointer *)(p_Var13 + 0x40) = pbStack_e0;
      *(pointer *)(p_Var13 + 0x48) = puVar8;
      local_b8.column_schema = (ParquetColumnSchema *)0x0;
      local_b8._vptr_ColumnWriter = (_func_int **)0x0;
      local_b8.writer = (ParquetWriter *)0x0;
      std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 *)&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      pp_Var14 = (_func_int **)operator_new(0x40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148);
      pbVar6 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar5 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *pp_Var14 = (_func_int *)&PTR__ColumnWriter_00497170;
      pp_Var14[1] = (_func_int *)local_158;
      pp_Var14[2] = (_func_int *)local_130;
      pp_Var14[3] = (_func_int *)pbVar4;
      pp_Var14[4] = (_func_int *)pbVar5;
      pp_Var14[5] = (_func_int *)pbVar6;
      local_118._0_8_ = (ParquetColumnSchema *)0x0;
      local_128._0_8_ = (pointer)0x0;
      local_128._8_8_ = (ParquetWriter *)0x0;
      *(code *)(pp_Var14 + 6) = local_159;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      *pp_Var14 = (_func_int *)&PTR__ListColumnWriter_0049fde0;
      pp_Var14[7] = p_Var13;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      (local_150._M_head_impl)->_vptr_ColumnWriter = pp_Var14;
      goto LAB_0024a55f;
    }
    bVar17 = LVar1 == (LogicalType)0x6c;
LAB_0024a5a6:
    if (bVar17) {
      local_128._0_8_ = (pointer)(local_128 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"list","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_);
      }
      pvVar12 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&schema->children,0);
      this_00 = &local_b8.schema_path.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148);
      CreateWriterRecursive
                (&local_b8,(ClientContext *)local_e8,local_158,parquet_schemas,pvVar12,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8.schema_path.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      if (LVar1 == (LogicalType)0x65) {
        this_01 = (ArrayColumnWriter *)operator_new(0x40);
        pbVar4 = (pointer)(local_148->field_2)._M_allocated_capacity;
        pbVar5 = (pointer)(local_148->_M_dataplus)._M_p;
        pbVar6 = (pointer)local_148->_M_string_length;
        (local_148->_M_dataplus)._M_p = (pointer)0x0;
        local_148->_M_string_length = 0;
        (local_148->field_2)._M_allocated_capacity = 0;
        this_03 = &local_d8;
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this_01->super_ListColumnWriter).super_ColumnWriter.writer = local_158;
        (this_01->super_ListColumnWriter).super_ColumnWriter.column_schema = local_130;
        (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar5;
        (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
        (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar4;
        local_118._0_8_ = (ParquetColumnSchema *)0x0;
        local_128._0_8_ = (pointer)0x0;
        local_128._8_8_ = (ParquetWriter *)0x0;
        (this_01->super_ListColumnWriter).super_ColumnWriter.can_have_nulls = (bool)local_159;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128);
        (this_01->super_ListColumnWriter).super_ColumnWriter._vptr_ColumnWriter =
             (_func_int **)&PTR__ListColumnWriter_0049fde0;
        (this_01->super_ListColumnWriter).child_writer.
        super_unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
        super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>.
        super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl =
             (ColumnWriter *)local_b8._vptr_ColumnWriter;
      }
      else {
        this_01 = (ArrayColumnWriter *)operator_new(0x40);
        local_128._0_8_ = (local_148->_M_dataplus)._M_p;
        local_128._8_8_ = local_148->_M_string_length;
        local_118._0_8_ = (local_148->field_2)._M_allocated_capacity;
        (local_148->_M_dataplus)._M_p = (pointer)0x0;
        local_148->_M_string_length = 0;
        (local_148->field_2)._M_allocated_capacity = 0;
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._vptr_ColumnWriter;
        ArrayColumnWriter::ArrayColumnWriter
                  (this_01,local_158,local_130,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_128,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)&local_d8,(bool)local_159);
        if ((ColumnWriter *)
            local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (ColumnWriter *)0x0) {
          (*(*(_func_int ***)
              &(local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[1])();
        }
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        this_03 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_03);
      *(ArrayColumnWriter **)local_150._M_head_impl = this_01;
      return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
             local_150._M_head_impl;
    }
  }
  switch(LVar1) {
  case (LogicalType)0xa:
    make_uniq<duckdb::BooleanColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0xb:
    make_uniq<duckdb::StandardColumnWriter<signed_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0xc:
    goto LAB_0024ac93;
  case (LogicalType)0xd:
  case (LogicalType)0xf:
switchD_0024aa68_caseD_d:
    make_uniq<duckdb::StandardColumnWriter<int,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0xe:
  case (LogicalType)0x10:
  case (LogicalType)0x12:
  case (LogicalType)0x13:
  case (LogicalType)0x20:
switchD_0024aa68_caseD_e:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x11:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x14:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampNSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x15:
    cVar2 = local_130->field_0x29;
    if (cVar2 == '\t') goto switchD_0024aa68_caseD_e;
    if (cVar2 == '\a') goto switchD_0024aa68_caseD_d;
    if (cVar2 != '\x05') {
      make_uniq<duckdb::FixedDecimalColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
                ((duckdb *)local_128,local_158,local_130,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_148,(bool *)&local_159);
      break;
    }
LAB_0024ac93:
    make_uniq<duckdb::StandardColumnWriter<short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x16:
    make_uniq<duckdb::StandardColumnWriter<duckdb::float_na_equal,float,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x17:
    make_uniq<duckdb::StandardColumnWriter<duckdb::double_na_equal,double,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x18:
  case (LogicalType)0x21:
  case (LogicalType)0x23:
  case (LogicalType)0x24:
  case (LogicalType)0x25:
  case (LogicalType)0x26:
  case (LogicalType)0x27:
  case (LogicalType)0x28:
  case (LogicalType)0x29:
  case (LogicalType)0x2a:
  case (LogicalType)0x2b:
  case (LogicalType)0x2c:
  case (LogicalType)0x2d:
  case (LogicalType)0x2e:
  case (LogicalType)0x2f:
  case (LogicalType)0x30:
  case (LogicalType)0x33:
  case (LogicalType)0x34:
  case (LogicalType)0x35:
switchD_0024aa68_caseD_18:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Unsupported type \"%s\" in Parquet writer","");
    duckdb::LogicalType::ToString_abi_cxx11_();
    InternalException::InternalException<std::__cxx11::string>
              (this_02,(string *)local_128,&local_80);
    __cxa_throw(this_02,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case (LogicalType)0x19:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x1a:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x1b:
    make_uniq<duckdb::StandardColumnWriter<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x1c:
    make_uniq<duckdb::StandardColumnWriter<unsigned_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x1d:
    make_uniq<duckdb::StandardColumnWriter<unsigned_short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x1e:
    make_uniq<duckdb::StandardColumnWriter<unsigned_int,unsigned_int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x1f:
    make_uniq<duckdb::StandardColumnWriter<unsigned_long,unsigned_long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x22:
    make_uniq<duckdb::StandardColumnWriter<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x31:
    make_uniq<duckdb::StandardColumnWriter<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x32:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case (LogicalType)0x36:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  default:
    if (LVar1 != (LogicalType)0x68) goto switchD_0024aa68_caseD_18;
    make_uniq<duckdb::EnumColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
  }
LAB_0024ada9:
  (local_150._M_head_impl)->_vptr_ColumnWriter = (_func_int **)local_128._0_8_;
  return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>)
         (_Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>)
         local_150._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriter>
ColumnWriter::CreateWriterRecursive(ClientContext &context, ParquetWriter &writer,
                                    const vector<duckdb_parquet::SchemaElement> &parquet_schemas,
                                    const ParquetColumnSchema &schema, vector<string> path_in_schema) {
	auto &type = schema.type;
	auto can_have_nulls = parquet_schemas[schema.schema_index].repetition_type == FieldRepetitionType::OPTIONAL;
	path_in_schema.push_back(schema.name);
	if (type.id() == LogicalTypeId::STRUCT || type.id() == LogicalTypeId::UNION) {
		// construct the child writers recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(schema.children.size());
		for (auto &child_column : schema.children) {
			child_writers.push_back(
			    CreateWriterRecursive(context, writer, parquet_schemas, child_column, path_in_schema));
		}
		return make_uniq<StructColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writers),
		                                     can_have_nulls);
	}
	if (type.id() == LogicalTypeId::LIST || type.id() == LogicalTypeId::ARRAY) {
		auto is_list = type.id() == LogicalTypeId::LIST;
		path_in_schema.push_back("list");
		auto child_writer = CreateWriterRecursive(context, writer, parquet_schemas, schema.children[0], path_in_schema);
		if (is_list) {
			return make_uniq<ListColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                   can_have_nulls);
		} else {
			return make_uniq<ArrayColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                    can_have_nulls);
		}
	}
	if (type.id() == LogicalTypeId::MAP) {
		path_in_schema.push_back("key_value");
		// construct the child types recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(2);
		for (idx_t i = 0; i < 2; i++) {
			// key needs to be marked as REQUIRED
			auto child_writer =
			    CreateWriterRecursive(context, writer, parquet_schemas, schema.children[i], path_in_schema);
			child_writers.push_back(std::move(child_writer));
		}
		auto struct_writer =
		    make_uniq<StructColumnWriter>(writer, schema, path_in_schema, std::move(child_writers), can_have_nulls);
		return make_uniq<ListColumnWriter>(writer, schema, path_in_schema, std::move(struct_writer), can_have_nulls);
	}
	if (type.id() == LogicalTypeId::BLOB && type.GetAlias() == "WKB_BLOB" &&
	    GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context)) {
		return make_uniq<WKBColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls, schema.name);
	}

	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<BooleanColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TINYINT:
		return make_uniq<StandardColumnWriter<int8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                        can_have_nulls);
	case LogicalTypeId::SMALLINT:
		return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
		return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::TIME_TZ:
		return make_uniq<StandardColumnWriter<dtime_tz_t, int64_t, ParquetTimeTZOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::HUGEINT:
		return make_uniq<StandardColumnWriter<hugeint_t, double, ParquetHugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UHUGEINT:
		return make_uniq<StandardColumnWriter<uhugeint_t, double, ParquetUhugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampNSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_SEC:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UTINYINT:
		return make_uniq<StandardColumnWriter<uint8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::USMALLINT:
		return make_uniq<StandardColumnWriter<uint16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                          can_have_nulls);
	case LogicalTypeId::UINTEGER:
		return make_uniq<StandardColumnWriter<uint32_t, uint32_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::UBIGINT:
		return make_uniq<StandardColumnWriter<uint64_t, uint64_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::FLOAT:
		return make_uniq<StandardColumnWriter<float_na_equal, float, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DOUBLE:
		return make_uniq<StandardColumnWriter<double_na_equal, double, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT32:
			return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT64:
			return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		default:
			return make_uniq<FixedDecimalColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
		}
	case LogicalTypeId::BLOB:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetBlobOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::VARCHAR:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetStringOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UUID:
		return make_uniq<StandardColumnWriter<hugeint_t, ParquetUUIDTargetType, ParquetUUIDOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::INTERVAL:
		return make_uniq<StandardColumnWriter<interval_t, ParquetIntervalTargetType, ParquetIntervalOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::ENUM:
		return make_uniq<EnumColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	default:
		throw InternalException("Unsupported type \"%s\" in Parquet writer", type.ToString());
	}
}